

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

TestLog * glu::operator<<(TestLog *log,ShaderInfo *shaderInfo)

{
  qpShaderType type;
  TestLog *pTVar1;
  LogShader local_68;
  ShaderInfo *local_18;
  ShaderInfo *shaderInfo_local;
  TestLog *log_local;
  
  local_18 = shaderInfo;
  shaderInfo_local = (ShaderInfo *)log;
  type = getLogShaderType(shaderInfo->type);
  tcu::LogShader::LogShader
            (&local_68,type,&local_18->source,(bool)(local_18->compileOk & 1),&local_18->infoLog);
  pTVar1 = tcu::TestLog::operator<<(log,&local_68);
  tcu::LogShader::~LogShader(&local_68);
  return pTVar1;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const ShaderInfo& shaderInfo)
{
	return log << tcu::TestLog::Shader(getLogShaderType(shaderInfo.type), shaderInfo.source, shaderInfo.compileOk, shaderInfo.infoLog);
}